

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

void force_wmtype(WarpedMotionParams *wm,TransformationType wmtype)

{
  TransformationType wmtype_local;
  WarpedMotionParams *wm_local;
  
  switch(wmtype) {
  case '\0':
    wm->wmmat[0] = 0;
    wm->wmmat[1] = 0;
  case '\x01':
    wm->wmmat[2] = 0x10000;
    wm->wmmat[3] = 0;
  case '\x02':
    wm->wmmat[4] = -wm->wmmat[3];
    wm->wmmat[5] = wm->wmmat[2];
  case '\x03':
  default:
    wm->wmtype = wmtype;
    return;
  }
}

Assistant:

static void force_wmtype(WarpedMotionParams *wm, TransformationType wmtype) {
  switch (wmtype) {
    case IDENTITY:
      wm->wmmat[0] = 0;
      wm->wmmat[1] = 0;
      AOM_FALLTHROUGH_INTENDED;
    case TRANSLATION:
      wm->wmmat[2] = 1 << WARPEDMODEL_PREC_BITS;
      wm->wmmat[3] = 0;
      AOM_FALLTHROUGH_INTENDED;
    case ROTZOOM:
      wm->wmmat[4] = -wm->wmmat[3];
      wm->wmmat[5] = wm->wmmat[2];
      AOM_FALLTHROUGH_INTENDED;
    case AFFINE: break;
    default: assert(0);
  }
  wm->wmtype = wmtype;
}